

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

intptr_t http1_hijack(http_s *h,fio_str_info_s *leftover)

{
  uintptr_t uVar1;
  char *pcVar2;
  intptr_t uuid;
  size_t sVar3;
  
  if (leftover != (fio_str_info_s *)0x0) {
    uVar1 = (h->private_data).flag;
    pcVar2 = *(char **)(uVar1 + 0x58);
    sVar3 = (uVar1 - (long)pcVar2) + *(long *)(uVar1 + 0xe8) + 0x103;
    if (sVar3 == 0) {
      leftover->capa = 0;
      leftover->len = 0;
      leftover->data = (char *)0x0;
    }
    else {
      leftover->capa = 0;
      leftover->len = sVar3;
      leftover->data = pcVar2;
    }
  }
  *(undefined1 *)((h->private_data).flag + 0x102) = 3;
  uuid = *(intptr_t *)((h->private_data).flag + 0x30);
  fio_attach(uuid,(fio_protocol_s *)0x0);
  return uuid;
}

Assistant:

static intptr_t http1_hijack(http_s *h, fio_str_info_s *leftover) {
  if (leftover) {
    intptr_t len =
        handle2pr(h)->buf_len -
        (intptr_t)(handle2pr(h)->parser.state.next - handle2pr(h)->buf);
    if (len) {
      *leftover = (fio_str_info_s){
          .len = len, .data = (char *)handle2pr(h)->parser.state.next};
    } else {
      *leftover = (fio_str_info_s){.len = 0, .data = NULL};
    }
  }

  handle2pr(h)->stop = 3;
  intptr_t uuid = handle2pr(h)->p.uuid;
  fio_attach(uuid, NULL);
  return uuid;
}